

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv_listen(uv_stream_t *stream,int backlog,uv_connection_cb cb)

{
  int local_2c;
  int err;
  uv_connection_cb cb_local;
  int backlog_local;
  uv_stream_t *stream_local;
  
  if ((stream->flags & 3) == 0) {
    if (stream->type == UV_NAMED_PIPE) {
      local_2c = uv__pipe_listen((uv_pipe_t *)stream,backlog,cb);
    }
    else if (stream->type == UV_TCP) {
      local_2c = uv__tcp_listen((uv_tcp_t *)stream,backlog,cb);
    }
    else {
      local_2c = -0x16;
    }
    if (((local_2c == 0) && ((stream->flags & 4) == 0)) &&
       (stream->flags = stream->flags | 4, (stream->flags & 8) != 0)) {
      stream->loop->active_handles = stream->loop->active_handles + 1;
    }
    stream_local._4_4_ = local_2c;
  }
  else {
    stream_local._4_4_ = -0x16;
  }
  return stream_local._4_4_;
}

Assistant:

int uv_listen(uv_stream_t* stream, int backlog, uv_connection_cb cb) {
  int err;
  if (uv__is_closing(stream)) {
    return UV_EINVAL;
  }
  switch (stream->type) {
  case UV_TCP:
    err = uv__tcp_listen((uv_tcp_t*)stream, backlog, cb);
    break;

  case UV_NAMED_PIPE:
    err = uv__pipe_listen((uv_pipe_t*)stream, backlog, cb);
    break;

  default:
    err = UV_EINVAL;
  }

  if (err == 0)
    uv__handle_start(stream);

  return err;
}